

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scalar_4x64_impl.h
# Opt level: O0

void secp256k1_scalar_set_b32(secp256k1_scalar *r,uchar *b32,int *overflow)

{
  int iVar1;
  uint64_t uVar2;
  int *in_RDX;
  secp256k1_scalar *in_RSI;
  secp256k1_scalar *in_RDI;
  int over;
  
  uVar2 = secp256k1_read_be64((uchar *)(in_RSI->d + 3));
  in_RDI->d[0] = uVar2;
  uVar2 = secp256k1_read_be64((uchar *)(in_RSI->d + 2));
  in_RDI->d[1] = uVar2;
  uVar2 = secp256k1_read_be64((uchar *)(in_RSI->d + 1));
  in_RDI->d[2] = uVar2;
  uVar2 = secp256k1_read_be64((uchar *)in_RSI);
  in_RDI->d[3] = uVar2;
  secp256k1_scalar_check_overflow(in_RDI);
  iVar1 = secp256k1_scalar_reduce(in_RSI,(uint)((ulong)in_RDX >> 0x20));
  if (in_RDX != (int *)0x0) {
    *in_RDX = iVar1;
  }
  return;
}

Assistant:

static void secp256k1_scalar_set_b32(secp256k1_scalar *r, const unsigned char *b32, int *overflow) {
    int over;
    r->d[0] = secp256k1_read_be64(&b32[24]);
    r->d[1] = secp256k1_read_be64(&b32[16]);
    r->d[2] = secp256k1_read_be64(&b32[8]);
    r->d[3] = secp256k1_read_be64(&b32[0]);
    over = secp256k1_scalar_reduce(r, secp256k1_scalar_check_overflow(r));
    if (overflow) {
        *overflow = over;
    }
}